

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void laguerre_ek_compute(int n,double *x,double *w)

{
  ulong uVar1;
  double *e;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)n;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = uVar4 * 8;
  }
  e = (double *)operator_new__(uVar2);
  if (0 < n) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      e[uVar2] = (double)(int)uVar1;
      uVar2 = uVar1;
    } while (uVar4 != uVar1);
    if (0 < n) {
      lVar3 = 0;
      do {
        *(double *)((long)x + lVar3 * 4) = (double)((int)lVar3 + 1);
        lVar3 = lVar3 + 2;
      } while (uVar4 * 2 != lVar3);
      *w = 1.0;
      if (n != 1) {
        memset(w + 1,0,(ulong)(n - 1) << 3);
      }
      imtqlx(n,x,e,w);
      uVar2 = 0;
      do {
        w[uVar2] = w[uVar2] * w[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
      goto LAB_001e8b29;
    }
  }
  *w = 1.0;
  imtqlx(n,x,e,w);
LAB_001e8b29:
  operator_delete__(e);
  return;
}

Assistant:

void laguerre_ek_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_EK_COMPUTE: Laguerre quadrature rule by the Elhay-Kautsky method.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *bj;
  int i;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = 1.0;
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    bj[i] = double( i + 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = double( 2 * i + 1 );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}